

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFSystemError.hh
# Opt level: O3

void __thiscall QPDFSystemError::~QPDFSystemError(QPDFSystemError *this)

{
  ~QPDFSystemError(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

~QPDFSystemError() noexcept override = default;